

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::StoreTestInstance::StoreTestInstance
          (StoreTestInstance *this,Context *context,Texture *texture,VkFormat format,
          bool declareImageFormatInShader,bool singleLayerBind)

{
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> data;
  Allocator *allocator_00;
  Allocator *device_00;
  VkDevice vk_00;
  VkDeviceSize VVar1;
  Buffer *this_00;
  Buffer *in_stack_fffffffffffffec8;
  DefaultDeleter<vkt::image::Buffer> local_b5;
  deUint32 local_b4;
  VkBufferCreateInfo local_b0;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_78;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *local_68;
  Allocator *local_58;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  undefined1 local_26;
  undefined1 local_25;
  VkFormat local_24;
  bool singleLayerBind_local;
  bool declareImageFormatInShader_local;
  Texture *pTStack_20;
  VkFormat format_local;
  Texture *texture_local;
  Context *context_local;
  StoreTestInstance *this_local;
  
  local_26 = singleLayerBind;
  local_25 = declareImageFormatInShader;
  local_24 = format;
  pTStack_20 = texture;
  texture_local = (Texture *)context;
  context_local = (Context *)this;
  BaseTestInstance::BaseTestInstance
            (&this->super_BaseTestInstance,context,texture,format,declareImageFormatInShader,
             singleLayerBind);
  (this->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__StoreTestInstance_0166be40;
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr
            (&this->m_imageBuffer);
  Texture::size((Texture *)&vk);
  VVar1 = getImageSizeBytes((IVec3 *)&vk,local_24);
  this->m_imageSizeBytes = VVar1;
  device = (VkDevice)
           Context::getDeviceInterface((this->super_BaseTestInstance).super_TestInstance.m_context);
  allocator = (Allocator *)
              Context::getDevice((this->super_BaseTestInstance).super_TestInstance.m_context);
  local_58 = Context::getDefaultAllocator
                       ((this->super_BaseTestInstance).super_TestInstance.m_context);
  this_00 = (Buffer *)operator_new(0x30);
  vk_00 = device;
  device_00 = allocator;
  allocator_00 = local_58;
  makeBufferCreateInfo(&local_b0,this->m_imageSizeBytes,10);
  local_b4 = ::vk::MemoryRequirement::HostVisible.m_flags;
  image::Buffer::Buffer
            (this_00,(DeviceInterface *)vk_00,(VkDevice)device_00,allocator_00,&local_b0,
             ::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vkt::image::Buffer>::DefaultDeleter(&local_b5);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_78);
  local_68 = de::details::MovePtr::operator_cast_to_PtrData(&local_78,(MovePtr *)this_00);
  data._8_8_ = local_68;
  data.ptr = in_stack_fffffffffffffec8;
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::operator=
            (&this->m_imageBuffer,data);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::~MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_78);
  return;
}

Assistant:

StoreTestInstance::StoreTestInstance (Context& context, const Texture& texture, const VkFormat format, const bool declareImageFormatInShader, const bool singleLayerBind)
	: BaseTestInstance		(context, texture, format, declareImageFormatInShader, singleLayerBind)
	, m_imageSizeBytes		(getImageSizeBytes(texture.size(), format))
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	Allocator&				allocator	= m_context.getDefaultAllocator();

	// A helper buffer with enough space to hold the whole image. Usage flags accommodate all derived test instances.

	m_imageBuffer = de::MovePtr<Buffer>(new Buffer(
		vk, device, allocator,
		makeBufferCreateInfo(m_imageSizeBytes, VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT),
		MemoryRequirement::HostVisible));
}